

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O3

bool IsSegmentApproximationClose(double tmin,double tmax,Coeff2 coeff,SegmentQ s,double error)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  Point p;
  double dVar4;
  
  dVar3 = (tmax - tmin) * 0.25;
  dVar1 = tmin + dVar3;
  bVar2 = true;
  while( true ) {
    if (tmax + -1e-06 <= dVar1) {
      return bVar2;
    }
    p.x = ((dVar1 * coeff._M_elems[3].x + coeff._M_elems[2].x) * dVar1 + coeff._M_elems[1].x) *
          dVar1 + coeff._M_elems[0].x;
    p.y = ((dVar1 * coeff._M_elems[3].y + coeff._M_elems[2].y) * dVar1 + coeff._M_elems[1].y) *
          dVar1 + coeff._M_elems[0].y;
    dVar4 = MinDistanceToQuad(p,s);
    bVar2 = dVar4 <= error;
    if (error < dVar4) break;
    dVar1 = dVar1 + dVar3;
  }
  return bVar2;
}

Assistant:

bool IsSegmentApproximationClose(double tmin, double tmax, Coeff2 coeff,
                                 SegmentQ s, double error)
{
	int n = 4;
	double dt = (tmax - tmin) / n;
	for (double t = tmin + dt; t < tmax - 1e-6; t += dt)
	{
		Point p = CalcPoint(t, coeff);
		if (MinDistanceToQuad(p, s) > error)
			return false;
	}
	return true;
}